

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginFunctionBody
          (BinaryReaderIR *this,Index index,Offset size)

{
  char *__s;
  Func *pFVar1;
  size_t sVar2;
  Result RVar3;
  size_t sVar4;
  
  __s = this->filename_;
  pFVar1 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
           _M_impl.super__Vector_impl_data._M_start[index];
  this->current_func_ = pFVar1;
  sVar4 = strlen(__s);
  sVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  (pFVar1->loc).filename._M_len = sVar4;
  (pFVar1->loc).filename._M_str = __s;
  (pFVar1->loc).field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(pFVar1->loc).field_1 + 8) = 0;
  RVar3 = PushLabel(this,First,&this->current_func_->exprs,(Expr *)0x0);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::BeginFunctionBody(Index index, Offset size) {
  current_func_ = module_->funcs[index];
  current_func_->loc = GetLocation();
  return PushLabel(LabelType::Func, &current_func_->exprs);
}